

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Compiler.cpp
# Opt level: O0

void __thiscall
soul::Compiler::compileAllModules
          (Compiler *this,Namespace *parentNamespace,Program *program,ProcessorBase *processorToRun)

{
  bool bVar1;
  size_type __n;
  Module *o;
  ArrayView<soul::pool_ref<soul::Module>_> local_c0;
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>_> local_b0;
  pool_ref<soul::AST::ModuleBase> local_a0;
  pool_ptr<soul::AST::ModuleBase> local_98;
  pool_ref<soul::Module> local_90;
  reference local_88;
  pool_ref<soul::AST::ModuleBase> *m;
  iterator __end1;
  iterator __begin1;
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  *__range1;
  vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> heartModules;
  undefined1 local_40 [8];
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  soulModules;
  ProcessorBase *processorToRun_local;
  Program *program_local;
  Namespace *parentNamespace_local;
  Compiler *this_local;
  
  soulModules.
  super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)processorToRun;
  std::
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ::vector((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
            *)local_40);
  ASTUtilities::findAllModulesToCompile
            (parentNamespace,
             (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
              *)local_40);
  std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::vector
            ((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *
             )&__range1);
  __n = std::
        vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
        ::size((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                *)local_40);
  std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::reserve
            ((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *
             )&__range1,__n);
  __end1 = std::
           vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
           ::begin((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                    *)local_40);
  m = (pool_ref<soul::AST::ModuleBase> *)
      std::
      vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
      ::end((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             *)local_40);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
                                *)&m);
    if (!bVar1) break;
    local_88 = __gnu_cxx::
               __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
               ::operator*(&__end1);
    pool_ref::operator_cast_to_pool_ptr((pool_ref *)&local_98);
    local_a0.object = local_88->object;
    bVar1 = soul::operator==(&local_a0,
                             (ProcessorBase *)
                             soulModules.
                             super__Vector_base<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    o = createHEARTModule(program,&local_98,bVar1);
    pool_ref<soul::Module>::pool_ref<soul::Module,void>(&local_90,o);
    std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::
    push_back((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
               *)&__range1,&local_90);
    pool_ref<soul::Module>::~pool_ref(&local_90);
    pool_ref<soul::AST::ModuleBase>::~pool_ref(&local_a0);
    pool_ptr<soul::AST::ModuleBase>::~pool_ptr(&local_98);
    __gnu_cxx::
    __normal_iterator<soul::pool_ref<soul::AST::ModuleBase>_*,_std::vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>_>
    ::operator++(&__end1);
  }
  ArrayView<soul::pool_ref<soul::AST::ModuleBase>>::
  ArrayView<std::vector<soul::pool_ref<soul::AST::ModuleBase>,std::allocator<soul::pool_ref<soul::AST::ModuleBase>>>>
            ((ArrayView<soul::pool_ref<soul::AST::ModuleBase>> *)&local_b0,
             (vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
              *)local_40);
  ArrayView<soul::pool_ref<soul::Module>>::
  ArrayView<std::vector<soul::pool_ref<soul::Module>,std::allocator<soul::pool_ref<soul::Module>>>>
            ((ArrayView<soul::pool_ref<soul::Module>> *)&local_c0,
             (vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *
             )&__range1);
  HEARTGenerator::build(local_b0,local_c0,0xff);
  std::vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>::~vector
            ((vector<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_> *
             )&__range1);
  std::
  vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
  ::~vector((vector<soul::pool_ref<soul::AST::ModuleBase>,_std::allocator<soul::pool_ref<soul::AST::ModuleBase>_>_>
             *)local_40);
  return;
}

Assistant:

void Compiler::compileAllModules (const AST::Namespace& parentNamespace, Program& program,
                                  AST::ProcessorBase& processorToRun)
{
    std::vector<pool_ref<AST::ModuleBase>> soulModules;
    ASTUtilities::findAllModulesToCompile (parentNamespace, soulModules);

    std::vector<pool_ref<Module>> heartModules;
    heartModules.reserve (soulModules.size());

    for (auto& m : soulModules)
        heartModules.push_back (createHEARTModule (program, m, m == processorToRun));

    HEARTGenerator::build (soulModules, heartModules);
}